

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermOut.cpp
# Opt level: O0

bool __thiscall
glslang::TOutputTraverser::visitBranch(TOutputTraverser *this,TVisit param_1,TIntermBranch *node)

{
  TInfoSink *infoSink;
  TOperator TVar1;
  TIntermTyped *pTVar2;
  TInfoSink *out;
  TIntermBranch *node_local;
  TVisit param_1_local;
  TOutputTraverser *this_local;
  
  infoSink = this->infoSink;
  OutputTreeText(infoSink,&node->super_TIntermNode,(this->super_TIntermTraverser).depth);
  TVar1 = TIntermBranch::getFlowOp(node);
  switch(TVar1) {
  case EOpKill:
    TInfoSinkBase::operator<<(&infoSink->debug,"Branch: Kill");
    break;
  case EOpTerminateInvocation:
    TInfoSinkBase::operator<<(&infoSink->debug,"Branch: TerminateInvocation");
    break;
  case EOpDemote:
    TInfoSinkBase::operator<<(&infoSink->debug,"Demote");
    break;
  case EOpTerminateRayKHR:
    TInfoSinkBase::operator<<(&infoSink->debug,"Branch: TerminateRayKHR");
    break;
  case EOpIgnoreIntersectionKHR:
    TInfoSinkBase::operator<<(&infoSink->debug,"Branch: IgnoreIntersectionKHR");
    break;
  case EOpReturn:
    TInfoSinkBase::operator<<(&infoSink->debug,"Branch: Return");
    break;
  case EOpBreak:
    TInfoSinkBase::operator<<(&infoSink->debug,"Branch: Break");
    break;
  case EOpContinue:
    TInfoSinkBase::operator<<(&infoSink->debug,"Branch: Continue");
    break;
  case EOpCase:
    TInfoSinkBase::operator<<(&infoSink->debug,"case: ");
    break;
  case EOpDefault:
    TInfoSinkBase::operator<<(&infoSink->debug,"default: ");
    break;
  default:
    TInfoSinkBase::operator<<(&infoSink->debug,"Branch: Unknown Branch");
  }
  pTVar2 = TIntermBranch::getExpression(node);
  if (pTVar2 == (TIntermTyped *)0x0) {
    TInfoSinkBase::operator<<(&infoSink->debug,"\n");
  }
  else {
    TInfoSinkBase::operator<<(&infoSink->debug," with expression\n");
    (this->super_TIntermTraverser).depth = (this->super_TIntermTraverser).depth + 1;
    pTVar2 = TIntermBranch::getExpression(node);
    (*(pTVar2->super_TIntermNode)._vptr_TIntermNode[2])(pTVar2,this);
    (this->super_TIntermTraverser).depth = (this->super_TIntermTraverser).depth + -1;
  }
  return false;
}

Assistant:

bool TOutputTraverser::visitBranch(TVisit /* visit*/, TIntermBranch* node)
{
    TInfoSink& out = infoSink;

    OutputTreeText(out, node, depth);

    switch (node->getFlowOp()) {
    case EOpKill:                   out.debug << "Branch: Kill";                  break;
    case EOpTerminateInvocation:    out.debug << "Branch: TerminateInvocation";   break;
    case EOpIgnoreIntersectionKHR:  out.debug << "Branch: IgnoreIntersectionKHR"; break;
    case EOpTerminateRayKHR:        out.debug << "Branch: TerminateRayKHR";       break;
    case EOpBreak:                  out.debug << "Branch: Break";                 break;
    case EOpContinue:               out.debug << "Branch: Continue";              break;
    case EOpReturn:                 out.debug << "Branch: Return";                break;
    case EOpCase:                   out.debug << "case: ";                        break;
    case EOpDemote:                 out.debug << "Demote";                        break;
    case EOpDefault:                out.debug << "default: ";                     break;
    default:                        out.debug << "Branch: Unknown Branch";        break;
    }

    if (node->getExpression()) {
        out.debug << " with expression\n";
        ++depth;
        node->getExpression()->traverse(this);
        --depth;
    } else
        out.debug << "\n";

    return false;
}